

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

size_t bitset_next_set_bits(bitset_t *bitset,size_t *buffer,size_t capacity,size_t *startfrom)

{
  int iVar1;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  size_t sVar2;
  long *in_RDI;
  int r;
  uint64_t t;
  size_t base;
  size_t howmany;
  uint64_t w;
  size_t x;
  long local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  size_t local_8;
  
  if (in_RDX == 0) {
    local_8 = 0;
  }
  else {
    local_30 = *in_RCX >> 6;
    if (local_30 < (ulong)in_RDI[1]) {
      local_38 = *(ulong *)(*in_RDI + local_30 * 8) >> ((byte)*in_RCX & 0x3f);
      local_40 = 0;
      local_48 = local_30 << 6;
      while (local_40 < in_RDX) {
        for (; local_38 != 0; local_38 = local_38 & (local_38 ^ 0xffffffffffffffff) + 1 ^ local_38)
        {
          iVar1 = roaring_trailing_zeroes(local_38);
          sVar2 = local_40 + 1;
          *(long *)(in_RSI + local_40 * 8) = iVar1 + local_48;
          local_40 = sVar2;
          if (sVar2 == in_RDX) goto LAB_0017b833;
        }
        local_30 = local_30 + 1;
        if (local_30 == in_RDI[1]) break;
        local_48 = local_48 + 0x40;
        local_38 = *(ulong *)(*in_RDI + local_30 * 8);
      }
LAB_0017b833:
      if (local_40 != 0) {
        *in_RCX = *(ulong *)(in_RSI + (local_40 - 1) * 8);
      }
      local_8 = local_40;
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

inline size_t bitset_next_set_bits(const bitset_t *bitset, size_t *buffer,
                                   size_t capacity, size_t *startfrom) {
    if (capacity == 0) return 0;  // sanity check
    size_t x = *startfrom / 64;
    if (x >= bitset->arraysize) {
        return 0;  // nothing more to iterate over
    }
    uint64_t w = bitset->array[x];
    w >>= (*startfrom & 63);
    size_t howmany = 0;
    size_t base = x << 6;
    while (howmany < capacity) {
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            buffer[howmany++] = r + base;
            if (howmany == capacity) goto end;
            w ^= t;
        }
        x += 1;
        if (x == bitset->arraysize) {
            break;
        }
        base += 64;
        w = bitset->array[x];
    }
end:
    if (howmany > 0) {
        *startfrom = buffer[howmany - 1];
    }
    return howmany;
}